

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::from_kreach(Graph *this,string *filename)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar1;
  iterator iVar2;
  pointer pvVar3;
  pointer puVar4;
  pointer puVar5;
  char cVar6;
  istream *piVar7;
  ulong uVar8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  long lVar9;
  ulong uVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *i;
  pointer pvVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *i_1;
  vertex_t current_vertex;
  vertex_t neighbor;
  string line;
  size_t num_edges;
  vertex_t num_neighbors;
  stringstream ss;
  ifstream fin;
  uint local_580;
  uint local_57c;
  undefined1 *local_578;
  undefined8 local_570;
  undefined1 local_568;
  undefined7 uStack_567;
  degree_t *local_558;
  long local_550;
  stringstream local_548 [128];
  ios_base local_4c8 [264];
  stringstream local_3c0 [128];
  ios_base local_340 [264];
  long local_238 [65];
  
  std::__cxx11::stringstream::stringstream(local_3c0);
  local_578 = &local_568;
  local_570 = 0;
  local_568 = 0;
  std::ifstream::ifstream(local_238,(string *)filename,_S_in);
  cVar6 = std::__basic_file<char>::is_open();
  if (cVar6 == '\0') {
    __assert_fail("fin.is_open()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lebdron[P]dynamic-k-reach/index/Graph.cpp"
                  ,0x10,"void Graph::from_kreach(const std::string &)");
  }
  cVar6 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_578,cVar6);
  std::__cxx11::stringstream::stringstream(local_548,(string *)&local_578,_S_out|_S_in);
  std::__cxx11::stringstream::operator=(local_3c0,local_548);
  std::__cxx11::stringstream::~stringstream(local_548);
  std::ios_base::~ios_base(local_4c8);
  local_558 = &this->num_vertices_;
  piVar7 = std::istream::_M_extract<unsigned_int>((uint *)local_3c0);
  std::istream::_M_extract<unsigned_long>((ulong *)piVar7);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(&this->succ_,(ulong)this->num_vertices_);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(&this->pred_,(ulong)this->num_vertices_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->deg_,(ulong)this->num_vertices_);
  local_580 = 0;
  lVar9 = 0;
  do {
    cVar6 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_578,cVar6);
    if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
      if (local_580 + 1 != *local_558) {
        __assert_fail("current_vertex + 1 == num_vertices_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lebdron[P]dynamic-k-reach/index/Graph.cpp"
                      ,0x29,"void Graph::from_kreach(const std::string &)");
      }
      if (lVar9 == local_550) {
        pvVar3 = (this->succ_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pvVar11 = (this->succ_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pvVar11 != pvVar3;
            pvVar11 = pvVar11 + 1) {
          puVar4 = (pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          puVar5 = (pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          if (puVar4 != puVar5) {
            uVar8 = (long)puVar5 - (long)puVar4 >> 2;
            lVar9 = 0x3f;
            if (uVar8 != 0) {
              for (; uVar8 >> lVar9 == 0; lVar9 = lVar9 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (puVar4,puVar5,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (puVar4,puVar5);
          }
        }
        pvVar3 = (this->pred_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pvVar11 = (this->pred_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pvVar11 != pvVar3;
            pvVar11 = pvVar11 + 1) {
          puVar4 = (pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          puVar5 = (pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          if (puVar4 != puVar5) {
            uVar8 = (long)puVar5 - (long)puVar4 >> 2;
            lVar9 = 0x3f;
            if (uVar8 != 0) {
              for (; uVar8 >> lVar9 == 0; lVar9 = lVar9 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (puVar4,puVar5,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (puVar4,puVar5);
          }
        }
        std::ifstream::~ifstream(local_238);
        if (local_578 != &local_568) {
          operator_delete(local_578,CONCAT71(uStack_567,local_568) + 1);
        }
        std::__cxx11::stringstream::~stringstream(local_3c0);
        std::ios_base::~ios_base(local_340);
        return;
      }
      __assert_fail("counted_edges == num_edges",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lebdron[P]dynamic-k-reach/index/Graph.cpp"
                    ,0x2a,"void Graph::from_kreach(const std::string &)");
    }
    std::__cxx11::stringstream::stringstream(local_548,(string *)&local_578,_S_out|_S_in);
    std::__cxx11::stringstream::operator=(local_3c0,local_548);
    std::__cxx11::stringstream::~stringstream(local_548);
    std::ios_base::~ios_base(local_4c8);
    std::istream::_M_extract<unsigned_int>((uint *)local_3c0);
    std::istream::_M_extract<unsigned_int>((uint *)local_3c0);
    while( true ) {
      piVar7 = std::istream::_M_extract<unsigned_int>((uint *)local_3c0);
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
      uVar10 = (ulong)local_580;
      pvVar11 = (this->succ_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->succ_).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar11 >> 3) *
              -0x5555555555555555;
      if (uVar8 < uVar10 || uVar8 - uVar10 == 0) {
LAB_00103368:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pvVar11 + uVar10);
      iVar2._M_current = *(uint **)(pvVar1 + 8);
      if (iVar2._M_current == *(uint **)(pvVar1 + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(pvVar1,iVar2,&local_57c);
      }
      else {
        *iVar2._M_current = local_57c;
        *(uint **)(pvVar1 + 8) = iVar2._M_current + 1;
      }
      uVar10 = (ulong)local_57c;
      pvVar11 = (this->pred_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->pred_).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar11 >> 3) *
              -0x5555555555555555;
      if (uVar8 < uVar10 || uVar8 - uVar10 == 0) goto LAB_00103368;
      pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pvVar11 + uVar10);
      iVar2._M_current = *(uint **)(pvVar1 + 8);
      if (iVar2._M_current == *(uint **)(pvVar1 + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(pvVar1,iVar2,&local_580);
      }
      else {
        *iVar2._M_current = local_580;
        *(uint **)(pvVar1 + 8) = iVar2._M_current + 1;
      }
      lVar9 = lVar9 + 1;
    }
  } while( true );
}

Assistant:

void Graph::from_kreach(const std::string &filename) {
    stringstream ss;
    string line;

    ifstream fin(filename);
    assert(fin.is_open());

    size_t num_edges;
    getline(fin, line);
    ss = stringstream(line);
    ss >> num_vertices_ >> num_edges;

    succ_.resize(num_vertices_);
    pred_.resize(num_vertices_);
    deg_.resize(num_vertices_);

    vertex_t current_vertex = 0;
    size_t counted_edges = 0;
    for (; getline(fin, line);) {
        ss = stringstream(line);
        ss >> current_vertex;
        vertex_t num_neighbors;
        ss >> num_neighbors;
        for (vertex_t neighbor; ss >> neighbor;) {
            succ_.at(current_vertex).push_back(neighbor);
            pred_.at(neighbor).push_back(current_vertex);
            ++counted_edges;
        }
    }

    assert(current_vertex + 1 == num_vertices_);
    assert(counted_edges == num_edges);

    for (auto &i : succ_) {
        sort(i.begin(), i.end());
    }
    for (auto &i : pred_) {
        sort(i.begin(), i.end());
    }
}